

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_info.cpp
# Opt level: O0

ostream * CMU462::Collada::operator<<(ostream *os,CameraInfo *camera)

{
  ostream *poVar1;
  long in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"CameraInfo: ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 0x28));
  poVar1 = std::operator<<(poVar1," (id: ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 8));
  poVar1 = std::operator<<(poVar1,")");
  poVar1 = std::operator<<(poVar1," [");
  poVar1 = std::operator<<(poVar1," hfov=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0x78));
  poVar1 = std::operator<<(poVar1," vfov=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0x7c));
  poVar1 = std::operator<<(poVar1," nclip=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0x80));
  poVar1 = std::operator<<(poVar1," fclip=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0x84));
  poVar1 = std::operator<<(poVar1," ]");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const CameraInfo& camera) {
  return os << "CameraInfo: " << camera.name << " (id: " << camera.id << ")"
            << " ["
            << " hfov=" << camera.hFov << " vfov=" << camera.vFov
            << " nclip=" << camera.nClip << " fclip=" << camera.fClip << " ]";
}